

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

bool __thiscall wabt::WastParser::ParseRefTypeOpt(WastParser *this,Type *out_type)

{
  TokenType TVar1;
  bool bVar2;
  Token token;
  Token TStack_58;
  
  bVar2 = false;
  TVar1 = Peek(this,0);
  if (TVar1 == First_Type) {
    Consume(&TStack_58,this);
    if ((TStack_58.token_type_ & ~AssertExhaustion) != First_Type) {
      __assert_fail("HasType()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/token.h"
                    ,0x68,"Type wabt::Token::type() const");
    }
    if ((TStack_58.field_2.type_.enum_ == ExternRef) &&
       ((this->options_->features).reference_types_enabled_ != true)) {
      bVar2 = false;
    }
    else {
      out_type->enum_ = TStack_58.field_2.text_._M_len._0_4_;
      out_type->type_index_ = TStack_58.field_2.type_.type_index_;
      bVar2 = true;
    }
  }
  return bVar2;
}

Assistant:

bool WastParser::ParseRefTypeOpt(Type* out_type) {
  WABT_TRACE(ParseRefTypeOpt);
  if (!PeekMatch(TokenType::ValueType)) {
    return false;
  }

  Token token = Consume();
  Type type = token.type();
  if (type == Type::ExternRef &&
      !options_->features.reference_types_enabled()) {
    return false;
  }

  *out_type = type;
  return true;
}